

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestCaseFilters::addTags(TestCaseFilters *this,string *tagPattern)

{
  TagExpressionParser local_78;
  undefined1 local_30 [8];
  TagExpression exp;
  string *tagPattern_local;
  TestCaseFilters *this_local;
  
  exp.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tagPattern;
  TagExpression::TagExpression((TagExpression *)local_30);
  TagExpressionParser::TagExpressionParser(&local_78,(TagExpression *)local_30);
  TagParser::parse(&local_78.super_TagParser,
                   (string *)
                   exp.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  TagExpressionParser::~TagExpressionParser(&local_78);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::push_back
            (&this->m_tagExpressions,(value_type *)local_30);
  TagExpression::~TagExpression((TagExpression *)local_30);
  return;
}

Assistant:

void addTags( const std::string& tagPattern ) {
            TagExpression exp;
            TagExpressionParser( exp ).parse( tagPattern );

            m_tagExpressions.push_back( exp );
        }